

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O0

_Bool mem_is_zero(void *mem,size_t len)

{
  ulong local_28;
  size_t i;
  size_t len_local;
  void *mem_local;
  
  local_28 = 0;
  while( true ) {
    if (len <= local_28) {
      return true;
    }
    if (*(char *)((long)mem + local_28) != '\0') break;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

static bool mem_is_zero(const void *mem, size_t len)
{
    size_t i;
    for (i = 0; i < len; ++i)
        if (((const unsigned char *)mem)[i])
            return false;
    return true;
}